

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O2

void ggml_quantize_mat_t<8l,(ggml_type)8>(float *x,void *vy,int64_t nrow,int64_t n_per_row)

{
  undefined1 (*pauVar1) [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  uint uVar8;
  undefined1 auVar9 [32];
  uint uVar10;
  ulong uVar11;
  undefined1 (*pauVar12) [32];
  undefined1 (*pauVar13) [32];
  long lVar14;
  long lVar15;
  undefined1 auVar16 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar20 [64];
  float fVar21;
  undefined1 in_ZMM10 [64];
  undefined1 auVar22 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar23 [64];
  __m256 srcv [4] [4];
  float local_2c0 [7];
  uint uStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float afStack_240 [8];
  undefined1 auStack_220 [32];
  undefined1 auStack_200 [32];
  undefined1 auStack_1e0 [32];
  float afStack_1c0 [32];
  float afStack_140 [32];
  float afStack_c0 [32];
  float afStack_40 [14];
  
  auVar9 = _DAT_0015bd60;
  pauVar12 = (undefined1 (*) [32])(x + 0x18);
  uVar10 = (uint)(n_per_row / 0x20);
  auVar16._8_4_ = 0x7fffffff;
  auVar16._0_8_ = 0x7fffffff7fffffff;
  auVar16._12_4_ = 0x7fffffff;
  auVar16._16_4_ = 0x7fffffff;
  auVar16._20_4_ = 0x7fffffff;
  auVar16._24_4_ = 0x7fffffff;
  auVar16._28_4_ = 0x7fffffff;
  for (uVar11 = 0; uVar11 != (~((int)uVar10 >> 0x1f) & uVar10); uVar11 = uVar11 + 1) {
    pauVar13 = pauVar12;
    for (lVar15 = 0; lVar14 = -0x80, lVar15 != 0x80; lVar15 = lVar15 + 0x20) {
      pauVar1 = pauVar13 + -3;
      auVar2 = pauVar13[-2];
      auVar3 = pauVar13[-1];
      auVar4 = *pauVar13;
      pauVar13 = (undefined1 (*) [32])(*pauVar13 + n_per_row * 4);
      auVar5 = vandps_avx(*pauVar1,auVar16);
      auVar6 = vandps_avx(auVar2,auVar16);
      *(undefined1 (*) [32])(afStack_240 + lVar15) = *pauVar1;
      *(undefined1 (*) [32])(auStack_220 + lVar15 * 4) = auVar2;
      *(undefined1 (*) [32])(auStack_200 + lVar15 * 4) = auVar3;
      *(undefined1 (*) [32])(auStack_1e0 + lVar15 * 4) = auVar4;
      auVar5 = vmaxps_avx(auVar5,auVar6);
      auVar2 = vandps_avx(auVar3,auVar16);
      auVar3 = vmaxps_avx(auVar5,auVar2);
      auVar2 = vandps_avx(auVar4,auVar16);
      auVar2 = vmaxps_avx(auVar3,auVar2);
      auVar19 = vmaxps_avx(auVar2._16_16_,auVar2._0_16_);
      auVar18 = vshufpd_avx(auVar19,auVar19,3);
      auVar19 = vmaxps_avx(auVar19,auVar18);
      auVar18 = vmovshdup_avx(auVar19);
      auVar19 = vmaxss_avx(auVar19,auVar18);
      auVar18._0_4_ = auVar19._0_4_ / 127.0;
      auVar18._4_12_ = auVar19._4_12_;
      fVar21 = 127.0 / auVar19._0_4_;
      in_ZMM10 = ZEXT464((uint)fVar21);
      uVar7 = vcmpss_avx512f(auVar19,ZEXT816(0) << 0x40,4);
      uVar8 = (uint)((byte)uVar7 & 1) * (int)fVar21;
      in_ZMM8 = ZEXT464(uVar8);
      auVar19 = vcvtps2ph_f16c(auVar18,0);
      in_ZMM9 = ZEXT1664(auVar19);
      vpextrw_avx(auVar19,0);
      *(uint *)((long)local_2c0 + lVar15) = uVar8;
      *(uint *)((long)local_2c0 + lVar15 + 4) = uVar8;
      *(uint *)((long)local_2c0 + lVar15 + 8) = uVar8;
      *(uint *)((long)local_2c0 + lVar15 + 0xc) = uVar8;
      *(uint *)((long)local_2c0 + lVar15 + 0x10) = uVar8;
      *(uint *)((long)local_2c0 + lVar15 + 0x14) = uVar8;
      *(uint *)((long)local_2c0 + lVar15 + 0x18) = uVar8;
      *(uint *)((long)&uStack_2a4 + lVar15) = uVar8;
    }
    for (; lVar14 != 0; lVar14 = lVar14 + 0x20) {
      auVar17._0_4_ = local_2c0[0] * *(float *)((long)afStack_1c0 + lVar14);
      auVar17._4_4_ = local_2c0[1] * *(float *)((long)afStack_1c0 + lVar14 + 4);
      auVar17._8_4_ = local_2c0[2] * *(float *)((long)afStack_1c0 + lVar14 + 8);
      auVar17._12_4_ = local_2c0[3] * *(float *)((long)afStack_1c0 + lVar14 + 0xc);
      auVar17._16_4_ = local_2c0[4] * *(float *)((long)afStack_1c0 + lVar14 + 0x10);
      auVar17._20_4_ = local_2c0[5] * *(float *)((long)afStack_1c0 + lVar14 + 0x14);
      auVar17._28_36_ = in_ZMM8._28_36_;
      auVar17._24_4_ = local_2c0[6] * *(float *)((long)afStack_1c0 + lVar14 + 0x18);
      auVar20._0_4_ = local_2a0 * *(float *)((long)afStack_140 + lVar14);
      auVar20._4_4_ = fStack_29c * *(float *)((long)afStack_140 + lVar14 + 4);
      auVar20._8_4_ = fStack_298 * *(float *)((long)afStack_140 + lVar14 + 8);
      auVar20._12_4_ = fStack_294 * *(float *)((long)afStack_140 + lVar14 + 0xc);
      auVar20._16_4_ = fStack_290 * *(float *)((long)afStack_140 + lVar14 + 0x10);
      auVar20._20_4_ = fStack_28c * *(float *)((long)afStack_140 + lVar14 + 0x14);
      auVar20._28_36_ = in_ZMM9._28_36_;
      auVar20._24_4_ = fStack_288 * *(float *)((long)afStack_140 + lVar14 + 0x18);
      auVar22._0_4_ = local_280 * *(float *)((long)afStack_c0 + lVar14);
      auVar22._4_4_ = fStack_27c * *(float *)((long)afStack_c0 + lVar14 + 4);
      auVar22._8_4_ = fStack_278 * *(float *)((long)afStack_c0 + lVar14 + 8);
      auVar22._12_4_ = fStack_274 * *(float *)((long)afStack_c0 + lVar14 + 0xc);
      auVar22._16_4_ = fStack_270 * *(float *)((long)afStack_c0 + lVar14 + 0x10);
      auVar22._20_4_ = fStack_26c * *(float *)((long)afStack_c0 + lVar14 + 0x14);
      auVar22._28_36_ = in_ZMM10._28_36_;
      auVar22._24_4_ = fStack_268 * *(float *)((long)afStack_c0 + lVar14 + 0x18);
      auVar23._0_4_ = local_260 * *(float *)((long)afStack_40 + lVar14);
      auVar23._4_4_ = fStack_25c * *(float *)((long)afStack_40 + lVar14 + 4);
      auVar23._8_4_ = fStack_258 * *(float *)((long)afStack_40 + lVar14 + 8);
      auVar23._12_4_ = fStack_254 * *(float *)((long)afStack_40 + lVar14 + 0xc);
      auVar23._16_4_ = fStack_250 * *(float *)((long)afStack_40 + lVar14 + 0x10);
      auVar23._20_4_ = fStack_24c * *(float *)((long)afStack_40 + lVar14 + 0x14);
      auVar23._28_36_ = in_ZMM11._28_36_;
      auVar23._24_4_ = fStack_248 * *(float *)((long)afStack_40 + lVar14 + 0x18);
      auVar2 = vroundps_avx(auVar17._0_32_,0);
      auVar3 = vroundps_avx(auVar20._0_32_,0);
      auVar4 = vroundps_avx(auVar23._0_32_,0);
      auVar5 = vroundps_avx(auVar22._0_32_,0);
      in_ZMM10 = ZEXT3264(auVar5);
      auVar2 = vcvtps2dq_avx(auVar2);
      auVar3 = vcvtps2dq_avx(auVar3);
      auVar4 = vcvtps2dq_avx(auVar4);
      in_ZMM11 = ZEXT3264(auVar4);
      auVar3 = vpackssdw_avx2(auVar2,auVar3);
      auVar2 = vcvtps2dq_avx(auVar5);
      auVar2 = vpackssdw_avx2(auVar2,auVar4);
      in_ZMM9 = ZEXT3264(auVar2);
      auVar2 = vpacksswb_avx2(auVar3,auVar2);
      auVar2 = vpermps_avx2(auVar9,auVar2);
      in_ZMM8 = ZEXT3264(auVar2);
      *(undefined1 (*) [32])((long)vy + lVar14 + 0x88) = auVar2;
    }
    vy = (void *)((long)vy + 0x88);
    pauVar12 = pauVar12 + 4;
  }
  return;
}

Assistant:

void ggml_quantize_mat_t<8, GGML_TYPE_Q8_0>(const float * GGML_RESTRICT x, void * GGML_RESTRICT vy, int64_t nrow, int64_t n_per_row) {
    assert(nrow == 4);
    UNUSED(nrow);
    ggml_quantize_mat_q8_0_4x8(x, vy, n_per_row);
}